

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

char * Supp_ManFetch(Supp_Man_t *p,int nSize)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  char *pcVar2;
  char *pMemory;
  int nSizeReal;
  int Type;
  int nSize_local;
  Supp_Man_t *p_local;
  
  if (nSize < 1) {
    __assert_fail("nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0x78,"char *Supp_ManFetch(Supp_Man_t *, int)");
  }
  iVar1 = Supp_SizeType(nSize,p->nStepSize);
  Vec_PtrFillExtra(p->vFree,iVar1 + 1,(void *)0x0);
  p_local = (Supp_Man_t *)Vec_PtrEntry(p->vFree,iVar1);
  if (p_local == (Supp_Man_t *)0x0) {
    iVar1 = p->nStepSize * iVar1;
    if (p->nFreeSize < iVar1) {
      pcVar2 = (char *)malloc((long)p->nChunkSize);
      p->pFreeBuf = pcVar2;
      p->nFreeSize = p->nChunkSize;
      Vec_PtrPush(p->vMemory,p->pFreeBuf);
    }
    if (p->nFreeSize < iVar1) {
      __assert_fail("p->nFreeSize >= nSizeReal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                    ,0x87,"char *Supp_ManFetch(Supp_Man_t *, int)");
    }
    p_local = (Supp_Man_t *)p->pFreeBuf;
    p->pFreeBuf = p->pFreeBuf + iVar1;
    p->nFreeSize = p->nFreeSize - iVar1;
  }
  else {
    p_00 = p->vFree;
    pcVar2 = Supp_OneNext((char *)p_local);
    Vec_PtrWriteEntry(p_00,iVar1,pcVar2);
  }
  return (char *)p_local;
}

Assistant:

char * Supp_ManFetch( Supp_Man_t * p, int nSize )
{
    int Type, nSizeReal;
    char * pMemory;
    assert( nSize > 0 );
    Type = Supp_SizeType( nSize, p->nStepSize );
    Vec_PtrFillExtra( p->vFree, Type + 1, NULL );
    if ( (pMemory = (char *)Vec_PtrEntry( p->vFree, Type )) )
    {
        Vec_PtrWriteEntry( p->vFree, Type, Supp_OneNext(pMemory) );
        return pMemory;
    }
    nSizeReal = p->nStepSize * Type;
    if ( p->nFreeSize < nSizeReal )
    {
        p->pFreeBuf = ABC_ALLOC( char, p->nChunkSize );
        p->nFreeSize = p->nChunkSize;
        Vec_PtrPush( p->vMemory, p->pFreeBuf );
    }
    assert( p->nFreeSize >= nSizeReal );
    pMemory = p->pFreeBuf;
    p->pFreeBuf  += nSizeReal;
    p->nFreeSize -= nSizeReal;
    return pMemory;
}